

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O3

xml_node<char> * __thiscall
rapidxml::xml_node<char>::next_sibling
          (xml_node<char> *this,char *name,size_t name_size,bool case_sensitive)

{
  byte *pbVar1;
  long lVar2;
  size_t sVar3;
  xml_node<char> *pxVar4;
  byte *pbVar5;
  char *end;
  byte *pbVar6;
  
  if ((this->super_xml_base<char>).m_parent == (xml_node<char> *)0x0) {
    __assert_fail("this->m_parent",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ufownl[P]ranger_bhvr_tree/contrib/rapidxml/rapidxml.hpp"
                  ,0x3ee,
                  "xml_node<Ch> *rapidxml::xml_node<>::next_sibling(const Ch *, std::size_t, bool) const [Ch = char]"
                 );
  }
  if (name == (char *)0x0) {
    pxVar4 = this->m_next_sibling;
  }
  else {
    if (name_size == 0) {
      sVar3 = 0xffffffffffffffff;
      do {
        name_size = sVar3 + 1;
        lVar2 = sVar3 + 1;
        sVar3 = name_size;
      } while (name[lVar2] != '\0');
    }
    for (pxVar4 = this->m_next_sibling; pxVar4 != (xml_node<char> *)0x0;
        pxVar4 = pxVar4->m_next_sibling) {
      pbVar5 = (byte *)(pxVar4->super_xml_base<char>).m_name;
      if (pbVar5 == (byte *)0x0) {
        pbVar5 = &xml_base<char>::nullstr()::zero;
        sVar3 = 0;
      }
      else {
        sVar3 = (pxVar4->super_xml_base<char>).m_name_size;
      }
      if (sVar3 == name_size) {
        pbVar1 = pbVar5 + name_size;
        if (case_sensitive) {
          pbVar6 = (byte *)name;
          if ((long)name_size < 1) {
            return pxVar4;
          }
          while (*pbVar5 == *pbVar6) {
            pbVar5 = pbVar5 + 1;
            pbVar6 = pbVar6 + 1;
            if (pbVar1 <= pbVar5) {
              return pxVar4;
            }
          }
        }
        else {
          pbVar6 = (byte *)name;
          if ((long)name_size < 1) {
            return pxVar4;
          }
          while (internal::lookup_tables<0>::lookup_upcase[*pbVar5] ==
                 internal::lookup_tables<0>::lookup_upcase[*pbVar6]) {
            pbVar5 = pbVar5 + 1;
            pbVar6 = pbVar6 + 1;
            if (pbVar1 <= pbVar5) {
              return pxVar4;
            }
          }
        }
      }
    }
    pxVar4 = (xml_node<char> *)0x0;
  }
  return pxVar4;
}

Assistant:

xml_node<Ch> *next_sibling(const Ch *name = 0, std::size_t name_size = 0, bool case_sensitive = true) const
        {
            assert(this->m_parent);     // Cannot query for siblings if node has no parent
            if (name)
            {
                if (name_size == 0)
                    name_size = internal::measure(name);
                for (xml_node<Ch> *sibling = m_next_sibling; sibling; sibling = sibling->m_next_sibling)
                    if (internal::compare(sibling->name(), sibling->name_size(), name, name_size, case_sensitive))
                        return sibling;
                return 0;
            }
            else
                return m_next_sibling;
        }